

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

RK_S32 mpi_dec_opt_n(void *ctx,char *next)

{
  int iVar1;
  MpiDecTestCmd *cmd;
  char *next_local;
  void *ctx_local;
  
  if (next == (char *)0x0) {
    _mpp_log_l(2,"mpi_dec_utils","invalid frame number\n",0);
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x220) = iVar1;
    if (*(int *)((long)ctx + 0x220) < 0) {
      _mpp_log_l(4,"mpi_dec_utils","infinite loop decoding mode\n",0);
    }
    ctx_local._4_4_ = 1;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpi_dec_opt_n(void *ctx, const char *next)
{
    MpiDecTestCmd *cmd = (MpiDecTestCmd *)ctx;

    if (next) {
        cmd->frame_num = atoi(next);

        if (cmd->frame_num < 0)
            mpp_log("infinite loop decoding mode\n");

        return 1;
    }

    mpp_err("invalid frame number\n");
    return 0;
}